

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::SparseTextureClampLookupResidencyTestCase::funcAllowed
          (SparseTextureClampLookupResidencyTestCase *this,GLint target,GLint format,
          FunctionToken *funcToken)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int iVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  
  p_Var1 = &(funcToken->allowedTargets)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (funcToken->allowedTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < target]) {
    if (target <= (int)p_Var5[1]._M_color) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var5 = p_Var4, target < (int)p_Var4[1]._M_color))
  {
    p_Var5 = &p_Var1->_M_header;
  }
  if (((_Rb_tree_header *)p_Var5 == p_Var1) ||
     ((target == 0x9009 && format == 0x81a5 &&
      (iVar3 = std::__cxx11::string::compare((char *)funcToken), iVar3 == 0)))) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool SparseTextureClampLookupResidencyTestCase::funcAllowed(GLint target, GLint format, FunctionToken& funcToken)
{
	if (funcToken.allowedTargets.find(target) == funcToken.allowedTargets.end())
		return false;

	if (format == GL_DEPTH_COMPONENT16)
	{
		if (target == GL_TEXTURE_CUBE_MAP_ARRAY && funcToken.name == "sparseTextureGradClampARB")
			return false;
	}

	return true;
}